

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::expectQueryError
          (GeometryProgramQueryCase *this,deUint32 program)

{
  ostringstream *poVar1;
  TestContext *this_00;
  int iVar2;
  undefined4 extraout_var;
  GLint dummy;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Querying ");
  local_1b0.m_value = this->m_target;
  local_1b0.m_getName = glu::getProgramParamName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,", expecting INVALID_OPERATION");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x9d8))(program,this->m_target,&dummy);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 != 0x502) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Expected INVALID_OPERATION, got ");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"got unexpected error code");
    }
  }
  return;
}

Assistant:

void GeometryProgramQueryCase::expectQueryError (deUint32 program)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	glw::GLint				dummy;
	glw::GLenum				errorCode;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying " << glu::getProgramParamStr(m_target) << ", expecting INVALID_OPERATION" << tcu::TestLog::EndMessage;
	gl.getProgramiv(program, m_target, &dummy);

	errorCode = gl.getError();

	if (errorCode != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Expected INVALID_OPERATION, got " << glu::getErrorStr(errorCode) << tcu::TestLog::EndMessage;

		// don't overwrite error
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected error code");
	}
}